

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.hpp
# Opt level: O0

VulkanMemoryAllocation * __thiscall
Diligent::RenderDeviceVkImpl::AllocateMemory
          (VulkanMemoryAllocation *__return_storage_ptr__,RenderDeviceVkImpl *this,VkDeviceSize Size
          ,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,VkMemoryAllocateFlags AllocateFlags)

{
  pointer this_00;
  Char *Message;
  VkMemoryPropertyFlags MemoryFlags;
  undefined1 local_58 [8];
  string msg;
  VkPhysicalDeviceMemoryProperties *MemoryProps;
  VkMemoryAllocateFlags AllocateFlags_local;
  uint32_t MemoryTypeIndex_local;
  VkDeviceSize Alignment_local;
  VkDeviceSize Size_local;
  RenderDeviceVkImpl *this_local;
  
  this_00 = std::
            unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ::operator->(&this->m_PhysicalDevice);
  msg.field_2._8_8_ = VulkanUtilities::VulkanPhysicalDevice::GetMemoryProperties(this_00);
  if (((VkPhysicalDeviceMemoryProperties *)msg.field_2._8_8_)->memoryTypeCount <= MemoryTypeIndex) {
    FormatString<char[26],char[46]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryTypeIndex < MemoryProps.memoryTypeCount",
               (char (*) [46])msg.field_2._8_8_);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AllocateMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderDeviceVkImpl.hpp"
               ,0xfc);
    std::__cxx11::string::~string((string *)local_58);
  }
  VulkanUtilities::VulkanMemoryManager::Allocate
            (__return_storage_ptr__,&this->m_MemoryMgr,Size,Alignment,MemoryTypeIndex,
             (*(uint *)(msg.field_2._8_8_ + 4 + (ulong)MemoryTypeIndex * 8) & 2) != 0,AllocateFlags)
  ;
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::VulkanMemoryAllocation AllocateMemory(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, VkMemoryAllocateFlags AllocateFlags = 0)
    {
        const auto& MemoryProps = m_PhysicalDevice->GetMemoryProperties();
        VERIFY_EXPR(MemoryTypeIndex < MemoryProps.memoryTypeCount);
        const auto MemoryFlags = MemoryProps.memoryTypes[MemoryTypeIndex].propertyFlags;
        return m_MemoryMgr.Allocate(Size, Alignment, MemoryTypeIndex, (MemoryFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0, AllocateFlags);
    }